

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O3

Tile mercatortile::quadkey_to_tile(string *qk)

{
  ulong uVar1;
  undefined8 *puVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  Tile TVar7;
  
  uVar1 = 0;
  TVar7.z = (uint)qk->_M_string_length;
  if (0 < (int)TVar7.z) {
    uVar4 = (ulong)(TVar7.z & 0x7fffffff) + 1;
    bVar3 = 0;
    uVar5 = 0;
    do {
      uVar6 = 1 << (bVar3 & 0x1f);
      switch((qk->_M_dataplus)._M_p[uVar4 - 2]) {
      case '0':
        break;
      case '1':
        uVar5 = (ulong)((uint)uVar5 | uVar6);
        break;
      case '3':
        uVar5 = (ulong)((uint)uVar5 | uVar6);
      case '2':
        uVar1 = (ulong)((uint)uVar1 | uVar6);
        break;
      default:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = "Unexpected quadkey digit.";
        __cxa_throw(puVar2,&char_const*::typeinfo,0);
      }
      uVar4 = uVar4 - 1;
      bVar3 = bVar3 + 1;
    } while (1 < uVar4);
    uVar1 = uVar1 << 0x20 | uVar5;
  }
  TVar7.x = (int)uVar1;
  TVar7.y = (int)(uVar1 >> 0x20);
  return TVar7;
}

Assistant:

Tile quadkey_to_tile(const std::string &qk)
{
    int zoom = qk.length();
    if (zoom == 0)
    {
        return Tile{0,0,0};
    } 
    int xtile = 0;
    int ytile = 0;
    for (int i = zoom; i>0; i--)
    {
        int mask = 1 << (zoom-i);
        int digit = qk[i-1]-'0';
        switch (digit)
        {
            
            case 0:
                break;
            case 1:
                xtile = xtile | mask;
                break;
            case 2:
                ytile = ytile | mask;
                break;
            case 3:
                xtile = xtile | mask;
                ytile = ytile | mask;
                break;
            default:
                throw "Unexpected quadkey digit.";
                break;
        }
    }
    
    return Tile{xtile, ytile, zoom};
}